

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line-parser.cpp
# Opt level: O2

int license::CommandLineParser::parseCommandLine(int argc,char **argv)

{
  _Rb_tree_node_base *__lhs;
  bool bVar1;
  char cVar2;
  typed_value<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_char>
  *ptVar3;
  options_description_easy_init *poVar4;
  positional_options_description *this;
  basic_command_line_parser<char> *pbVar5;
  any *operand;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
  *ptVar6;
  typed_value<boost::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  *ptVar7;
  value_semantic *pvVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  reference_type pbVar10;
  _Base_ptr p_Var11;
  ostream *poVar12;
  logic_error *this_00;
  any *operand_00;
  int iVar13;
  options_description *this_01;
  allocator local_621;
  bool base64;
  undefined7 uStack_61f;
  allocator local_614;
  allocator local_613;
  allocator local_612;
  allocator local_611;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmds;
  string project_folder;
  string templates_folder;
  string project_name;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  public_key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_570;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  project_folder_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  primary_key;
  parsed_options parsed;
  options_description project_desc;
  positional_options_description pos;
  variables_map vm;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
  local_1c0 [8];
  _Rb_tree_node_base local_1b8 [4];
  options_description global;
  options_description hidden;
  
  if (argc == 2) {
    std::__cxx11::string::string((string *)&project_desc,"-h",(allocator *)&project_folder_1);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &project_desc,argv[1]);
    if (bVar1) {
      std::__cxx11::string::~string((string *)&project_desc);
LAB_00175e0a:
      printBasicHelp(*argv);
      return 0;
    }
    std::__cxx11::string::string((string *)&vm,"--help",(allocator *)&global);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vm
                            ,argv[1]);
    std::__cxx11::string::~string((string *)&vm);
    std::__cxx11::string::~string((string *)&project_desc);
    if (bVar1) goto LAB_00175e0a;
  }
  else if (argc == 1) {
    printBasicHelp(*argv);
    return 1;
  }
  std::__cxx11::string::string((string *)&project_desc,"Global options",(allocator *)&vm);
  boost::program_options::options_description::options_description
            (&global,(string *)&project_desc,0x50,0x28);
  std::__cxx11::string::~string((string *)&project_desc);
  _project_desc = (pointer)boost::program_options::options_description::add_options(&global);
  boost::program_options::options_description_easy_init::operator()
            ((options_description_easy_init *)&project_desc,"verbose,v","Turn on verbose output");
  std::__cxx11::string::string((string *)&project_desc,"Hidden options",(allocator *)&vm);
  boost::program_options::options_description::options_description
            (&hidden,(string *)&project_desc,0x50,0x28);
  std::__cxx11::string::~string((string *)&project_desc);
  _project_desc = (pointer)boost::program_options::options_description::add_options(&hidden);
  ptVar3 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  poVar4 = (options_description_easy_init *)
           boost::program_options::options_description_easy_init::operator()
                     ((options_description_easy_init *)&project_desc,"command",
                      (value_semantic *)ptVar3,
                      "command to execute: project init, project list, license list, license issue")
  ;
  ptVar3 = boost::program_options::
           value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  boost::program_options::options_description_easy_init::operator()
            (poVar4,"subargs",(value_semantic *)ptVar3,
             "Arguments for command, use option --help to see");
  boost::program_options::positional_options_description::positional_options_description(&pos);
  this = (positional_options_description *)
         boost::program_options::positional_options_description::add(&pos,"command",2);
  boost::program_options::positional_options_description::add(this,"subargs",-1);
  boost::program_options::variables_map::variables_map(&vm);
  boost::program_options::basic_command_line_parser<char>::basic_command_line_parser
            ((basic_command_line_parser<char> *)&project_desc,argc,argv);
  pbVar5 = boost::program_options::basic_command_line_parser<char>::options
                     ((basic_command_line_parser<char> *)&project_desc,&global);
  pbVar5 = boost::program_options::basic_command_line_parser<char>::options(pbVar5,&hidden);
  boost::program_options::detail::cmdline::set_positional_options(&pbVar5->super_cmdline,&pos);
  boost::program_options::detail::cmdline::allow_unregistered(&pbVar5->super_cmdline);
  boost::program_options::basic_command_line_parser<char>::run(&parsed,pbVar5);
  boost::program_options::detail::cmdline::~cmdline((cmdline *)&project_desc);
  boost::program_options::store((basic_parsed_options *)&parsed,&vm,false);
  std::__cxx11::string::string((string *)&project_desc,"command",(allocator *)&project_folder_1);
  operand = (any *)boost::program_options::abstract_variables_map::operator[]
                             ((abstract_variables_map *)&vm,(string *)&project_desc);
  __x = boost::
        any_cast<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&>
                  (operand);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&cmds,__x);
  std::__cxx11::string::~string((string *)&project_desc);
  if ((ulong)((long)cmds.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)cmds.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
    printBasicHelp(*argv);
  }
  else {
    std::__cxx11::string::string((string *)&project_desc,"verbose",(allocator *)&project_folder_1);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::program_options::variable_value>_>_>
    ::count(local_1c0,(key_type *)&project_desc);
    std::__cxx11::string::~string((string *)&project_desc);
    bVar1 = std::operator==(cmds.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,"project");
    if (bVar1) {
      std::__cxx11::string::substr
                ((ulong)&project_desc,
                 (ulong)(cmds.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + 1));
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &project_desc,"init");
      std::__cxx11::string::~string((string *)&project_desc);
      if (bVar1) {
        std::__cxx11::string::string
                  ((string *)&project_folder_1,"project init options",(allocator *)&primary_key);
        boost::program_options::options_description::options_description
                  (&project_desc,(string *)&project_folder_1,0x50,0x28);
        std::__cxx11::string::~string((string *)&project_folder_1);
        project_name._M_dataplus._M_p = (pointer)&project_name.field_2;
        project_name._M_string_length = 0;
        project_name.field_2._M_local_buf[0] = '\0';
        primary_key.super_type._0_8_ = primary_key.super_type._0_8_ & 0xffffffffffffff00;
        project_folder._M_dataplus._M_p = (pointer)&project_folder.field_2;
        project_folder._M_string_length = 0;
        public_key.super_type._0_8_ = public_key.super_type._0_8_ & 0xffffffffffffff00;
        project_folder.field_2._M_local_buf[0] = '\0';
        templates_folder._M_dataplus._M_p = (pointer)&templates_folder.field_2;
        templates_folder._M_string_length = 0;
        templates_folder.field_2._M_local_buf[0] = '\0';
        local_4d0._M_dataplus._M_p =
             (pointer)boost::program_options::options_description::add_options(&project_desc);
        ptVar6 = boost::program_options::value<std::__cxx11::string>(&project_name);
        ptVar6->m_required = true;
        poVar4 = (options_description_easy_init *)
                 boost::program_options::options_description_easy_init::operator()
                           ((options_description_easy_init *)&local_4d0,"project-name,n",
                            (value_semantic *)ptVar6,"New project name (required).");
        ptVar7 = boost::program_options::value<boost::optional<std::__cxx11::string>>(&primary_key);
        poVar4 = (options_description_easy_init *)
                 boost::program_options::options_description_easy_init::operator()
                           (poVar4,"primary-key",(value_semantic *)ptVar7,
                            "use externally generated primary key, public key must also be specified."
                           );
        ptVar7 = boost::program_options::value<boost::optional<std::__cxx11::string>>(&public_key);
        poVar4 = (options_description_easy_init *)
                 boost::program_options::options_description_easy_init::operator()
                           (poVar4,"public-key",(value_semantic *)ptVar7,
                            "Use externally generated public key, private key must also be specified."
                           );
        ptVar6 = boost::program_options::value<std::__cxx11::string>(&project_folder);
        std::__cxx11::string::string((string *)&project_folder_1,".",(allocator *)&base64);
        ptVar6 = boost::program_options::
                 typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
                 ::default_value(ptVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&project_folder_1);
        poVar4 = (options_description_easy_init *)
                 boost::program_options::options_description_easy_init::operator()
                           (poVar4,"projects-folder,p",(value_semantic *)ptVar6,
                            "path to where all the projects configurations are stored.");
        ptVar6 = boost::program_options::value<std::__cxx11::string>(&templates_folder);
        std::__cxx11::string::string((string *)&local_570,".",&local_621);
        ptVar6 = boost::program_options::
                 typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
                 ::default_value(ptVar6,&local_570);
        poVar4 = (options_description_easy_init *)
                 boost::program_options::options_description_easy_init::operator()
                           (poVar4,"templates,t",(value_semantic *)ptVar6,
                            "path to the templates folder.");
        boost::program_options::options_description_easy_init::operator()
                  (poVar4,"help","Print this help.");
        std::__cxx11::string::~string((string *)&local_570);
        std::__cxx11::string::~string((string *)&project_folder_1);
        std::__cxx11::string::string
                  ((string *)&project_folder_1,"project init",(allocator *)&local_570);
        bVar1 = rerunBoostPO(&parsed,&project_desc,&vm,argv,(string *)&project_folder_1,&global);
        std::__cxx11::string::~string((string *)&project_folder_1);
        if (bVar1) {
          Project::Project((Project *)&project_folder_1,&project_name,&project_folder,
                           &templates_folder,false);
          Project::initialize((Project *)&project_folder_1);
          Project::~Project((Project *)&project_folder_1);
        }
        std::__cxx11::string::~string((string *)&templates_folder);
        std::__cxx11::string::~string((string *)&project_folder);
        boost::optional_detail::
        optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~optional_base(&public_key.super_type);
        boost::optional_detail::
        optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~optional_base(&primary_key.super_type);
        std::__cxx11::string::~string((string *)&project_name);
      }
      else {
        bVar1 = std::operator==(cmds.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1,"list");
        if (!bVar1) {
          poVar12 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
          poVar12 = std::operator<<(poVar12,"command ");
          poVar12 = std::operator<<(poVar12,(string *)
                                            cmds.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start);
          poVar12 = std::operator<<(poVar12," ");
          poVar12 = std::operator<<(poVar12,(string *)
                                            (cmds.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + 1));
          std::operator<<(poVar12," not recognized.");
          goto LAB_00176cc6;
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &primary_key,"project ",
                       cmds.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &project_folder_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &primary_key," options");
        boost::program_options::options_description::options_description
                  (&project_desc,(string *)&project_folder_1,0x50,0x28);
        std::__cxx11::string::~string((string *)&project_folder_1);
        std::__cxx11::string::~string((string *)&primary_key);
        project_folder_1.super_type.m_initialized = false;
        primary_key.super_type._0_8_ =
             boost::program_options::options_description::add_options(&project_desc);
        ptVar7 = boost::program_options::value<boost::optional<std::__cxx11::string>>
                           (&project_folder_1);
        poVar4 = (options_description_easy_init *)
                 boost::program_options::options_description_easy_init::operator()
                           ((options_description_easy_init *)&primary_key,"projects-folder,p",
                            (value_semantic *)ptVar7,
                            "path to where project configurations are stored.");
        boost::program_options::options_description_easy_init::operator()
                  (poVar4,"help","Print this help.");
        boost::optional_detail::
        optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~optional_base(&project_folder_1.super_type);
      }
      this_01 = &project_desc;
LAB_00176d32:
      boost::program_options::options_description::~options_description(this_01);
      iVar13 = 0;
      goto LAB_00176dab;
    }
    bVar1 = std::operator==(cmds.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,"license");
    if (bVar1) {
      bVar1 = std::operator==(cmds.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + 1,"issue");
      if (bVar1) {
        std::__cxx11::string::string
                  ((string *)&project_desc,"license issue options",(allocator *)&primary_key);
        boost::program_options::options_description::options_description
                  ((options_description *)&project_folder_1,(string *)&project_desc,0x50,0x28);
        std::__cxx11::string::~string((string *)&project_desc);
        public_key.super_type._0_8_ = (long)&public_key.super_type.m_storage.dummy_ + 8;
        public_key.super_type.m_storage.dummy_.aligner_ = (type)0x0;
        project_name._M_dataplus._M_p = (pointer)&project_name.field_2;
        project_name._M_string_length = 0;
        public_key.super_type.m_storage.dummy_.data[8] = '\0';
        project_name.field_2._M_local_buf[0] = '\0';
        base64 = false;
        local_4d0._M_dataplus._M_p =
             (pointer)boost::program_options::options_description::add_options
                                ((options_description *)&project_folder_1);
        pvVar8 = (value_semantic *)boost::program_options::bool_switch(&base64);
        poVar4 = (options_description_easy_init *)
                 boost::program_options::options_description_easy_init::operator()
                           ((options_description_easy_init *)&local_4d0,"base64,b",pvVar8,
                            "Encode license as base64 for inclusion in environment variables.");
        ptVar6 = boost::program_options::value<std::__cxx11::string>();
        poVar4 = (options_description_easy_init *)
                 boost::program_options::options_description_easy_init::operator()
                           (poVar4,"valid-from",(value_semantic *)ptVar6,
                            "Specify the start of the validity for this license.  Format YYYYMMDD. If not specified defaults to today"
                           );
        ptVar6 = boost::program_options::value<std::__cxx11::string>();
        poVar4 = (options_description_easy_init *)
                 boost::program_options::options_description_easy_init::operator()
                           (poVar4,"valid-to,e",(value_semantic *)ptVar6,
                            "Specify the expire date for this license.  Format YYYYMMDD. If not specified the license won\'t expire"
                           );
        ptVar6 = boost::program_options::value<std::__cxx11::string>();
        poVar4 = (options_description_easy_init *)
                 boost::program_options::options_description_easy_init::operator()
                           (poVar4,"client-signature,s",(value_semantic *)ptVar6,
                            "The signature of the hardware that requires the license. It should be in the format XXXX-XXXX-XXXX. If not specified the license won\'t be linked to a specific hardware (eg. demo license)."
                           );
        pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&public_key;
        ptVar6 = boost::program_options::value<std::__cxx11::string>(pbVar9);
        poVar4 = (options_description_easy_init *)
                 boost::program_options::options_description_easy_init::operator()
                           (poVar4,"output-file-name,o",(value_semantic *)ptVar6,
                            "License output file name. May contain / that will be interpreded as subfolders."
                           );
        ptVar7 = boost::program_options::value<boost::optional<std::__cxx11::string>>();
        poVar4 = (options_description_easy_init *)
                 boost::program_options::options_description_easy_init::operator()
                           (poVar4,"feature-names,f",(value_semantic *)ptVar7,
                            "Feature names: comma separate list of project features to enable. if not specified will be taken as project name."
                           );
        ptVar6 = boost::program_options::value<std::__cxx11::string>();
        poVar4 = (options_description_easy_init *)
                 boost::program_options::options_description_easy_init::operator()
                           (poVar4,"primary-key",(value_semantic *)ptVar6,
                            "Primary key location, in case it is not in default folder");
        ptVar6 = boost::program_options::value<std::__cxx11::string>(&project_name);
        std::__cxx11::string::string((string *)&project_desc,".",&local_621);
        ptVar6 = boost::program_options::
                 typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
                 ::default_value(ptVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&project_desc);
        poVar4 = (options_description_easy_init *)
                 boost::program_options::options_description_easy_init::operator()
                           (poVar4,"project-folder,p",(value_semantic *)ptVar6,
                            "path to where project configurations and licenses are stored.");
        ptVar6 = boost::program_options::value<std::__cxx11::string>();
        std::__cxx11::string::string((string *)&primary_key,"0",&local_611);
        std::__cxx11::string::string((string *)&project_folder,"All Versions",&local_612);
        ptVar6 = boost::program_options::
                 typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
                 ::default_value(ptVar6,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&primary_key,&project_folder);
        poVar4 = (options_description_easy_init *)
                 boost::program_options::options_description_easy_init::operator()
                           (poVar4,"start-version",(value_semantic *)ptVar6,
                            "Specify the first version of the software this license apply to.");
        ptVar6 = boost::program_options::value<std::__cxx11::string>();
        std::__cxx11::string::string((string *)&templates_folder,"0",&local_613);
        std::__cxx11::string::string((string *)&local_570,"All Versions",&local_614);
        ptVar6 = boost::program_options::
                 typed_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char>
                 ::default_value(ptVar6,&templates_folder,&local_570);
        poVar4 = (options_description_easy_init *)
                 boost::program_options::options_description_easy_init::operator()
                           (poVar4,"end-version",(value_semantic *)ptVar6,
                            "Specify the last version of the software this license apply to.");
        ptVar6 = boost::program_options::value<std::__cxx11::string>();
        poVar4 = (options_description_easy_init *)
                 boost::program_options::options_description_easy_init::operator()
                           (poVar4,"extra-data,x",(value_semantic *)ptVar6,
                            "Specify extra data to be included into the license");
        boost::program_options::options_description_easy_init::operator()
                  (poVar4,"help,h","Print this help.");
        std::__cxx11::string::~string((string *)&local_570);
        std::__cxx11::string::~string((string *)&templates_folder);
        std::__cxx11::string::~string((string *)&project_folder);
        std::__cxx11::string::~string((string *)&primary_key);
        std::__cxx11::string::~string((string *)&project_desc);
        std::__cxx11::string::string
                  ((string *)&project_desc,"license issue",(allocator *)&primary_key);
        bVar1 = rerunBoostPO(&parsed,(options_description *)&project_folder_1,&vm,argv,
                             (string *)&project_desc,&global);
        std::__cxx11::string::~string((string *)&project_desc);
        if (bVar1) {
          if (public_key.super_type.m_storage.dummy_.aligner_ == (type)0x0) {
            pbVar9 = (string *)0x0;
          }
          License::License((License *)&project_desc,pbVar9,&project_name,base64);
          for (p_Var11 = local_1b8[0]._M_left; p_Var11 != local_1b8;
              p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
            __lhs = p_Var11 + 1;
            bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,"command");
            if (((bVar1) &&
                (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)__lhs,"subargs"), bVar1)) &&
               (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)__lhs,"base64"), bVar1)) {
              pbVar9 = boost::any_cast<std::__cxx11::string>((any *)(p_Var11 + 2));
              if (pbVar9 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
                 ) {
                boost::any_cast<boost::optional<std::__cxx11::string>>
                          (&primary_key,(boost *)(p_Var11 + 2),operand_00);
                if (primary_key.super_type.m_initialized == true) {
                  pbVar10 = boost::
                            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            ::get(&primary_key);
                  License::add_parameter((License *)&project_desc,(string *)__lhs,pbVar10);
                }
                else {
                  poVar12 = std::operator<<((ostream *)&std::cout,(string *)__lhs);
                  poVar12 = std::operator<<(poVar12,"not recognized value error");
                  std::endl<char,std::char_traits<char>>(poVar12);
                }
                boost::optional_detail::
                optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::~optional_base(&primary_key.super_type);
              }
              else {
                License::add_parameter((License *)&project_desc,(string *)__lhs,pbVar9);
              }
            }
          }
          License::write_license((License *)&project_desc);
          poVar12 = std::operator<<((ostream *)&std::cout,"License written ");
          std::endl<char,std::char_traits<char>>(poVar12);
          License::~License((License *)&project_desc);
        }
        std::__cxx11::string::~string((string *)&project_name);
        std::__cxx11::string::~string((string *)&public_key);
        this_01 = (options_description *)&project_folder_1;
        goto LAB_00176d32;
      }
    }
    else {
      bVar1 = std::operator==(cmds.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,"test");
      if (bVar1) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &project_folder_1,"test ",
                       cmds.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + 1);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &project_desc,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &project_folder_1," options");
        boost::program_options::options_description::options_description
                  ((options_description *)&primary_key,(string *)&project_desc,0x50,0x28);
        std::__cxx11::string::~string((string *)&project_desc);
        std::__cxx11::string::~string((string *)&project_folder_1);
        bVar1 = std::operator==(cmds.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + 1,"sign");
        if (bVar1) {
          std::__cxx11::string::string
                    ((string *)&project_desc,"license issue options",(allocator *)&public_key);
          boost::program_options::options_description::options_description
                    ((options_description *)&project_folder_1,(string *)&project_desc,0x50,0x28);
          std::__cxx11::string::~string((string *)&project_desc);
          public_key.super_type._0_8_ = (long)&public_key.super_type.m_storage.dummy_ + 8;
          public_key.super_type.m_storage.dummy_.aligner_ = (type)0x0;
          project_name._M_dataplus._M_p = (pointer)&project_name.field_2;
          project_name._M_string_length = 0;
          public_key.super_type.m_storage.dummy_.data[8] = '\0';
          project_name.field_2._M_local_buf[0] = '\0';
          project_folder._M_dataplus._M_p = (pointer)&project_folder.field_2;
          project_folder._M_string_length = 0;
          project_folder.field_2._M_local_buf[0] = '\0';
          _project_desc =
               (pointer)boost::program_options::options_description::add_options
                                  ((options_description *)&project_folder_1);
          ptVar6 = boost::program_options::value<std::__cxx11::string>(&project_name);
          ptVar6->m_required = true;
          poVar4 = (options_description_easy_init *)
                   boost::program_options::options_description_easy_init::operator()
                             ((options_description_easy_init *)&project_desc,"data,d",
                              (value_semantic *)ptVar6,"Data to be signed");
          ptVar6 = boost::program_options::value<std::__cxx11::string>
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &public_key);
          ptVar6->m_required = true;
          poVar4 = (options_description_easy_init *)
                   boost::program_options::options_description_easy_init::operator()
                             (poVar4,"primary-key,p",(value_semantic *)ptVar6,"Primary key location"
                             );
          ptVar6 = boost::program_options::value<std::__cxx11::string>(&project_folder);
          ptVar6->m_required = true;
          boost::program_options::options_description_easy_init::operator()
                    (poVar4,"output,o",(value_semantic *)ptVar6,"file where to write output");
          std::__cxx11::string::string
                    ((string *)&project_desc,"license issue",(allocator *)&templates_folder);
          rerunBoostPO(&parsed,(options_description *)&project_folder_1,&vm,argv,
                       (string *)&project_desc,&global);
          std::__cxx11::string::~string((string *)&project_desc);
          CryptoHelper::getInstance();
          (**(code **)(*(long *)CONCAT71(uStack_61f,base64) + 0x18))
                    ((long *)CONCAT71(uStack_61f,base64),&public_key);
          (**(code **)(*(long *)CONCAT71(uStack_61f,base64) + 0x28))
                    (&templates_folder,(long *)CONCAT71(uStack_61f,base64),&project_name);
          bVar1 = std::operator!=(&project_folder,"cout");
          if (bVar1) {
            std::ofstream::ofstream(&project_desc);
            std::ofstream::open((string *)&project_desc,(_Ios_Openmode)&project_folder);
            cVar2 = std::__basic_file<char>::is_open();
            if (cVar2 == '\0') {
              this_00 = (logic_error *)__cxa_allocate_exception(0x10);
              std::operator+(&local_4d0,"can\'t create [",&project_folder);
              std::operator+(&local_570,&local_4d0,"]");
              std::logic_error::logic_error(this_00,(string *)&local_570);
              __cxa_throw(this_00,std::logic_error::typeinfo,std::logic_error::~logic_error);
            }
            std::operator<<((ostream *)&project_desc,(string *)&templates_folder);
            std::ofstream::close();
            std::ofstream::~ofstream(&project_desc);
          }
          else {
            poVar12 = std::operator<<((ostream *)&std::cout,(string *)&templates_folder);
            std::endl<char,std::char_traits<char>>(poVar12);
          }
          std::__cxx11::string::~string((string *)&templates_folder);
          if ((long *)CONCAT71(uStack_61f,base64) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(uStack_61f,base64) + 0x38))();
          }
          std::__cxx11::string::~string((string *)&project_folder);
          std::__cxx11::string::~string((string *)&project_name);
          std::__cxx11::string::~string((string *)&public_key);
          boost::program_options::options_description::~options_description
                    ((options_description *)&project_folder_1);
          iVar13 = 0;
        }
        else {
          iVar13 = 1;
        }
        boost::program_options::options_description::~options_description
                  ((options_description *)&primary_key);
        goto LAB_00176dab;
      }
    }
LAB_00176cc6:
    printBasicHelp(*argv);
  }
  iVar13 = 1;
LAB_00176dab:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&cmds);
  std::
  vector<boost::program_options::basic_option<char>,_std::allocator<boost::program_options::basic_option<char>_>_>
  ::~vector(&parsed.options);
  boost::program_options::variables_map::~variables_map(&vm);
  boost::program_options::positional_options_description::~positional_options_description(&pos);
  boost::program_options::options_description::~options_description(&hidden);
  boost::program_options::options_description::~options_description(&global);
  return iVar13;
}

Assistant:

int CommandLineParser::parseCommandLine(int argc, const char **argv) {
	if (argc == 1) {
		printBasicHelp(argv[0]);
		return 1;
	}
	if (argc == 2 && (string("-h") == argv[1] || string("--help") == argv[1])) {
		printBasicHelp(argv[0]);
		return 0;
	}
	int result = 0;
	po::options_description global("Global options");
	global.add_options()("verbose,v", "Turn on verbose output");
	po::options_description hidden("Hidden options");
	hidden.add_options()("command", po::value<std::vector<std::string>>(),
						 "command to execute: project init, project list, license list, license issue")(
		"subargs", po::value<std::vector<std::string>>(), "Arguments for command, use option --help to see");

	po::positional_options_description pos;
	pos.add("command", 2).add("subargs", -1);

	po::variables_map vm;

	po::parsed_options parsed =
		po::command_line_parser(argc, argv).options(global).options(hidden).positional(pos).allow_unregistered().run();
	po::store(parsed, vm);
	std::vector<std::string> cmds = vm["command"].as<std::vector<std::string>>();
	if (cmds.size() == 0 || cmds.size() == 1) {
		printBasicHelp(argv[0]);
		return 1;
	}
	bool verbose = vm.count("verbose") > 0;
	try {
		if (cmds[0] == "project") {
			if (cmds[1].substr(0, 4) == "init") {
				initializeProject(parsed, vm, argv, global);
			} else if (cmds[1] == "list") {
				po::options_description project_desc("project " + cmds[1] + " options");
				boost::optional<string> project_folder;
				project_desc.add_options()  //
					("projects-folder,p", po::value<boost::optional<string>>(&project_folder),
					 "path to where project configurations are stored.")  //
					("help", "Print this help.");  //

			} else {
				std::cerr << endl << "command " << cmds[0] << " " << cmds[1] << " not recognized.";
				printBasicHelp(argv[0]);
				result = 1;
			}
		} else if (cmds[0] == "license") {
			if (cmds[1] == "issue") {
				issueLicense(parsed, vm, argv, global);
			} else {
				printBasicHelp(argv[0]);
				result = 1;
			}
		} else if (cmds[0] == "test") {
			po::options_description license_desc("test " + cmds[1] + " options");
			if (cmds[1] == "sign") {
				test_sign(parsed, vm, argv, global);
			} else {
				result = 1;
			}
		} else {
			printBasicHelp(argv[0]);
			result = 1;
		}
	} catch (const invalid_argument &e) {
		printBasicHelp(argv[0]);
		cout << endl << "Parameter error: " << e.what() << endl;
		result = 1;
	}
	return result;
}